

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  ushort uVar2;
  uint uVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int j;
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  uint16_t buffer [16];
  __m256i counter [4];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined1 auVar27 [64];
  undefined1 auVar30 [64];
  
  for (uVar3 = len & 0xffffff00; uVar3 < len; uVar3 = uVar3 + 1) {
    uVar2 = array[uVar3];
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      flags[lVar8] = flags[lVar8] + (uint)((uVar2 >> ((uint)lVar8 & 0x1f) & 1) != 0);
    }
  }
  uVar5 = (ulong)(len >> 4 & 0xfffffff0);
  for (lVar8 = 0; lVar8 != 0x80; lVar8 = lVar8 + 0x20) {
    *(undefined8 *)(local_c0 + lVar8) = 0;
    *(undefined8 *)(local_c0 + lVar8 + 8) = 0;
    *(undefined8 *)(local_c0 + lVar8 + 0x10) = 0;
    *(undefined8 *)(local_c0 + lVar8 + 0x18) = 0;
  }
  auVar26._8_2_ = 0x5555;
  auVar26._0_8_ = 0x5555555555555555;
  auVar26._10_2_ = 0x5555;
  auVar26._12_2_ = 0x5555;
  auVar26._14_2_ = 0x5555;
  auVar26._16_2_ = 0x5555;
  auVar26._18_2_ = 0x5555;
  auVar26._20_2_ = 0x5555;
  auVar26._22_2_ = 0x5555;
  auVar26._24_2_ = 0x5555;
  auVar26._26_2_ = 0x5555;
  auVar26._28_2_ = 0x5555;
  auVar26._30_2_ = 0x5555;
  auVar28._8_2_ = 0x3333;
  auVar28._0_8_ = 0x3333333333333333;
  auVar28._10_2_ = 0x3333;
  auVar28._12_2_ = 0x3333;
  auVar28._14_2_ = 0x3333;
  auVar28._16_2_ = 0x3333;
  auVar28._18_2_ = 0x3333;
  auVar28._20_2_ = 0x3333;
  auVar28._22_2_ = 0x3333;
  auVar28._24_2_ = 0x3333;
  auVar28._26_2_ = 0x3333;
  auVar28._28_2_ = 0x3333;
  auVar28._30_2_ = 0x3333;
  auVar29._8_2_ = 0x707;
  auVar29._0_8_ = 0x707070707070707;
  auVar29._10_2_ = 0x707;
  auVar29._12_2_ = 0x707;
  auVar29._14_2_ = 0x707;
  auVar29._16_2_ = 0x707;
  auVar29._18_2_ = 0x707;
  auVar29._20_2_ = 0x707;
  auVar29._22_2_ = 0x707;
  auVar29._24_2_ = 0x707;
  auVar29._26_2_ = 0x707;
  auVar29._28_2_ = 0x707;
  auVar29._30_2_ = 0x707;
  auVar31._8_4_ = 0xf;
  auVar31._0_8_ = 0xf0000000f;
  auVar31._12_4_ = 0xf;
  auVar31._16_4_ = 0xf;
  auVar31._20_4_ = 0xf;
  auVar31._24_4_ = 0xf;
  auVar31._28_4_ = 0xf;
  auVar33 = ZEXT1664((undefined1  [16])0x0);
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  auVar24 = ZEXT1664((undefined1  [16])0x0);
  auVar25 = ZEXT1664((undefined1  [16])0x0);
  auVar32 = ZEXT1664((undefined1  [16])0x0);
  uVar4 = 0;
  while (uVar4 < uVar5) {
    uVar6 = uVar4 + 0xffff;
    if (uVar5 - uVar4 < 0x10000) {
      uVar6 = uVar5;
    }
    pauVar9 = (undefined1 (*) [32])(array + uVar4 * 0x10 + 0xf0);
    while( true ) {
      auVar34 = vpsrld_avx2(auVar33._0_32_,1);
      auVar14 = vpand_avx2(auVar33._0_32_,auVar26);
      if (uVar6 <= uVar4) break;
      auVar10 = vmovdqu64_avx512vl(pauVar9[-0xd]);
      auVar11 = vmovdqu64_avx512vl(pauVar9[-0xc]);
      auVar34 = vpand_avx2(auVar34,auVar26);
      uVar4 = uVar4 + 0x10;
      auVar14 = vphaddw_avx2(auVar14,auVar34);
      auVar34 = vpsrld_avx2(auVar14,2);
      auVar14 = vpand_avx2(auVar14,auVar28);
      auVar34 = vpand_avx2(auVar34,auVar28);
      auVar14 = vphaddw_avx2(auVar14,auVar34);
      auVar34 = vpxorq_avx512vl(pauVar9[-0xf],auVar32._0_32_);
      auVar12 = vpandq_avx512vl(auVar34,pauVar9[-0xe]);
      auVar35 = vpsrld_avx2(auVar14,4);
      auVar14 = vpand_avx2(auVar14,auVar29);
      auVar12 = vpternlogq_avx512vl(auVar12,pauVar9[-0xf],auVar32._0_32_,0xf8);
      auVar13 = vpxorq_avx512vl(auVar34,pauVar9[-0xe]);
      auVar34 = vpand_avx2(auVar35,auVar29);
      auVar35 = vpxorq_avx512vl(auVar13,auVar10);
      auVar34 = vphaddw_avx2(auVar14,auVar34);
      auVar14 = vpandq_avx512vl(auVar35,auVar11);
      auVar14 = vpternlogq_avx512vl(auVar14,auVar13,auVar10,0xf8);
      auVar10 = vpxorq_avx512vl(auVar35,auVar11);
      auVar11 = vpxorq_avx512vl(auVar12,auVar25._0_32_);
      auVar13 = vpandq_avx512vl(auVar14,auVar11);
      auVar12 = vpternlogq_avx512vl(auVar13,auVar12,auVar25._0_32_,0xf8);
      auVar13 = vpxorq_avx512vl(auVar10,pauVar9[-0xb]);
      auVar35 = vpandq_avx512vl(auVar13,pauVar9[-10]);
      auVar10 = vpternlogq_avx512vl(auVar35,auVar10,pauVar9[-0xb],0xf8);
      auVar13 = vpxorq_avx512vl(auVar13,pauVar9[-10]);
      auVar35 = vpxorq_avx512vl(auVar13,pauVar9[-9]);
      auVar15 = vpandq_avx512vl(auVar35,pauVar9[-8]);
      auVar13 = vpternlogq_avx512vl(auVar15,auVar13,pauVar9[-9],0xf8);
      auVar15 = vpxorq_avx512vl(auVar10,auVar14 ^ auVar11);
      auVar35 = vpxorq_avx512vl(auVar35,pauVar9[-8]);
      auVar16 = vpandq_avx512vl(auVar13,auVar15);
      auVar14 = vpternlogq_avx512vl(auVar16,auVar10,auVar14 ^ auVar11,0xf8);
      auVar10 = vpxorq_avx512vl(auVar13,auVar15);
      auVar11 = vpxorq_avx512vl(auVar12,auVar24._0_32_);
      auVar13 = vpandq_avx512vl(auVar14,auVar11);
      auVar12 = vpternlogq_avx512vl(auVar13,auVar12,auVar24._0_32_,0xf8);
      auVar14 = vpxorq_avx512vl(auVar14,auVar11);
      auVar11 = vmovdqu64_avx512vl(pauVar9[-6]);
      auVar13 = vpxorq_avx512vl(auVar35,pauVar9[-7]);
      auVar15 = vpandq_avx512vl(auVar13,auVar11);
      auVar35 = vpternlogq_avx512vl(auVar15,auVar35,pauVar9[-7],0xf8);
      auVar11 = vpxorq_avx512vl(auVar13,auVar11);
      auVar13 = vmovdqu64_avx512vl(pauVar9[-4]);
      auVar15 = vpxorq_avx512vl(auVar11,pauVar9[-5]);
      auVar16 = vpandq_avx512vl(auVar15,auVar13);
      auVar11 = vpternlogq_avx512vl(auVar16,auVar11,pauVar9[-5],0xf8);
      auVar16 = vpxorq_avx512vl(auVar35,auVar10);
      auVar13 = vpxorq_avx512vl(auVar15,auVar13);
      auVar15 = vmovdqu64_avx512vl(pauVar9[-2]);
      auVar17 = vpandq_avx512vl(auVar11,auVar16);
      auVar10 = vpternlogq_avx512vl(auVar17,auVar35,auVar10,0xf8);
      auVar11 = vpxorq_avx512vl(auVar11,auVar16);
      auVar35 = vpxorq_avx512vl(auVar13,pauVar9[-3]);
      auVar16 = vpandq_avx512vl(auVar35,auVar15);
      auVar13 = vpternlogq_avx512vl(auVar16,auVar13,pauVar9[-3],0xf8);
      pauVar1 = pauVar9 + -1;
      auVar35 = vpxorq_avx512vl(auVar35,auVar15);
      auVar15 = vmovdqu64_avx512vl(*pauVar9);
      pauVar9 = pauVar9 + 0x10;
      auVar16 = vpxorq_avx512vl(auVar35,*pauVar1);
      auVar17 = vpandq_avx512vl(auVar16,auVar15);
      auVar35 = vpternlogq_avx512vl(auVar17,auVar35,*pauVar1,0xf8);
      auVar17 = vpxorq_avx512vl(auVar13,auVar11);
      auVar15 = vpxorq_avx512vl(auVar16,auVar15);
      auVar32 = ZEXT3264(auVar15);
      auVar15 = vpandq_avx512vl(auVar35,auVar17);
      auVar11 = vpternlogq_avx512vl(auVar15,auVar13,auVar11,0xf8);
      auVar13 = vpxorq_avx512vl(auVar35,auVar17);
      auVar25 = ZEXT3264(auVar13);
      auVar13 = vpxorq_avx512vl(auVar10,auVar14);
      auVar35 = vpandq_avx512vl(auVar11,auVar13);
      auVar10 = vpternlogq_avx512vl(auVar35,auVar10,auVar14,0xf8);
      auVar14 = vpxorq_avx512vl(auVar11,auVar13);
      auVar24 = ZEXT3264(auVar14);
      auVar14 = vpand_avx2(auVar34,auVar31);
      local_c0 = vpaddd_avx2(auVar14,local_c0);
      auVar14 = vpsrld_avx2(auVar34,8);
      auVar14 = vpand_avx2(auVar14,auVar31);
      local_a0 = vpaddd_avx2(auVar14,local_a0);
      auVar14 = vpsrld_avx2(auVar34,0x10);
      auVar14 = vpand_avx2(auVar14,auVar31);
      local_80 = vpaddd_avx2(auVar14,local_80);
      auVar34 = vpsrld_avx2(auVar34,0x18);
      auVar14 = auVar12 ^ auVar23._0_32_;
      local_60 = vpaddd_avx2(auVar34,local_60);
      auVar34 = vpandq_avx512vl(auVar10,auVar14);
      auVar34 = vpternlogq_avx512vl(auVar34,auVar12,auVar23._0_32_,0xf8);
      auVar33 = ZEXT3264(auVar34);
      auVar14 = vpxorq_avx512vl(auVar10,auVar14);
      auVar23 = ZEXT3264(auVar14);
    }
    auVar34 = vpand_avx2(auVar34,auVar26);
    auVar14 = vphaddw_avx2(auVar14,auVar34);
    auVar34 = vpsrld_avx2(auVar14,2);
    auVar14 = vpand_avx2(auVar14,auVar28);
    auVar34 = vpand_avx2(auVar34,auVar28);
    auVar14 = vphaddw_avx2(auVar14,auVar34);
    auVar34 = vpsrld_avx2(auVar14,4);
    auVar14 = vpand_avx2(auVar14,auVar29);
    auVar34 = vpand_avx2(auVar34,auVar29);
    auVar34 = vphaddw_avx2(auVar14,auVar34);
    auVar14 = vpand_avx2(auVar34,auVar31);
    local_c0 = vpaddd_avx2(auVar14,local_c0);
    auVar14 = vpsrld_avx2(auVar34,8);
    auVar14 = vpand_avx2(auVar14,auVar31);
    local_a0 = vpaddd_avx2(auVar14,local_a0);
    auVar14 = vpsrld_avx2(auVar34,0x10);
    auVar34 = vpsrld_avx2(auVar34,0x18);
    auVar14 = vpand_avx2(auVar14,auVar31);
    local_60 = vpaddd_avx2(auVar34,local_60);
    local_80 = vpaddd_avx2(auVar14,local_80);
  }
  auVar28 = vpslld_avx2(local_80,4);
  auVar33 = vpmovsxbd_avx512f(_DAT_001140a0);
  auVar31 = vpslld_avx2(local_c0,4);
  auVar29 = vpslld_avx2(local_a0,4);
  auVar30 = ZEXT3264(auVar29);
  auVar26 = vpslld_avx2(local_60,4);
  auVar27 = ZEXT3264(auVar26);
  auVar18 = vpmovsxbd_avx512f(_DAT_001140b0);
  auVar19 = vpmovsxbd_avx512f(_DAT_001140c0);
  auVar20 = vpmovsxbd_avx512f(_DAT_001140d0);
  lVar8 = 0;
  auVar26 = vpermq_avx2(auVar28,0xd8);
  auVar28 = vpermi2ps_avx512vl(_DAT_00116300,auVar31,auVar26);
  auVar21 = vinsertf64x4_avx512f(ZEXT3264(auVar28),auVar29,1);
  auVar33 = vpermi2d_avx512f(auVar33,auVar21,auVar27);
  auVar21 = vpmovsxbd_avx512f(_DAT_001140e0);
  auVar33 = vpermi2d_avx512f(auVar21,auVar33,auVar30);
  auVar33 = vpermi2d_avx512f(auVar18,auVar33,auVar27);
  auVar18 = vpmovsxbq_avx512f(ZEXT816(0x9050403020100));
  auVar33 = vpermi2q_avx512f(auVar18,auVar33,auVar30);
  auVar18 = vpmovsxbd_avx512f(_DAT_001140f0);
  auVar33 = vpermi2d_avx512f(auVar19,auVar33,auVar27);
  auVar19 = vpmovsxbd_avx512f(_DAT_00114100);
  auVar33 = vpermi2d_avx512f(auVar19,auVar33,auVar30);
  auVar19 = vpmovsxbd_avx512f(_DAT_00114110);
  auVar33 = vpermi2d_avx512f(auVar20,auVar33,auVar27);
  auVar26 = vpermi2ps_avx512vl(_DAT_00116320,auVar31,auVar26);
  auVar20 = vpmovsxbd_avx512f(_DAT_00114120);
  auVar21 = vinsertf32x4_avx512f(ZEXT3264(auVar26),auVar29._16_16_,2);
  auVar22 = vpmovsxbd_avx512f(_DAT_00114130);
  auVar18 = vpermi2d_avx512f(auVar18,auVar21,auVar27);
  auVar18 = vpermi2d_avx512f(auVar19,auVar18,auVar30);
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0xb050403020100));
  auVar18 = vpermi2d_avx512f(auVar22,auVar18,auVar27);
  auVar21 = vpmovsxbd_avx512f(_DAT_00114140);
  auVar18 = vpermi2q_avx512f(auVar19,auVar18,auVar30);
  auVar19 = vpmovsxbd_avx512f(_DAT_00114150);
  auVar18 = vpermi2d_avx512f(auVar21,auVar18,auVar27);
  auVar18 = vpermi2d_avx512f(auVar19,auVar18,auVar30);
  auVar18 = vpermi2d_avx512f(auVar20,auVar18,auVar27);
  auVar33 = vpaddd_avx512f(auVar33,auVar18);
  auVar33 = vpaddd_avx512f(auVar33,*(undefined1 (*) [64])flags);
  auVar33 = vmovdqu64_avx512f(auVar33);
  *(undefined1 (*) [64])flags = auVar33;
  local_e0 = auVar32._0_32_;
  for (; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    uVar2 = *(ushort *)(local_e0 + lVar8 * 2);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  local_e0 = auVar25._0_32_;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    uVar2 = *(ushort *)(local_e0 + lVar8 * 2);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + ((uint)(uVar2 >> ((uint)lVar7 & 0x1f)) * 2 & 2);
    }
  }
  local_e0 = auVar24._0_32_;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    uVar2 = *(ushort *)(local_e0 + lVar8 * 2);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uVar2 >> ((uint)lVar7 & 0x1f) & 1) * 4;
    }
  }
  local_e0 = auVar23._0_32_;
  for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
    uVar2 = *(ushort *)(local_e0 + lVar8 * 2);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uVar2 >> ((uint)lVar7 & 0x1f) & 1) * 8;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m256i* data = (const __m256i*)array;
    size_t size = len / 16;
    __m256i v1  = _mm256_setzero_si256();
    __m256i v2  = _mm256_setzero_si256();
    __m256i v4  = _mm256_setzero_si256();
    __m256i v8  = _mm256_setzero_si256();
    __m256i v16 = _mm256_setzero_si256();
    __m256i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[16];
    __m256i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm256_setzero_si256();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m256i output; \
        { \
            const __m256i tmp0 = _mm256_and_si256(input, mask); \
            const __m256i tmp1 = _mm256_and_si256(_mm256_srli_epi32(input, shift), mask); \
            output = _mm256_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  0), _mm256_loadu_si256(data + i +  1));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i +  2), _mm256_loadu_si256(data + i +  3));
            pospopcnt_csa_avx2(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  4), _mm256_loadu_si256(data + i +  5));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i +  6), _mm256_loadu_si256(data + i +  7));
            pospopcnt_csa_avx2(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  8),  _mm256_loadu_si256(data + i +  9));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i + 10),  _mm256_loadu_si256(data + i + 11));
            pospopcnt_csa_avx2(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i + 12),  _mm256_loadu_si256(data + i + 13));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i + 14),  _mm256_loadu_si256(data + i + 15));
            pospopcnt_csa_avx2(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm256_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm256_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm256_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m256i mask_byte0 = _mm256_set1_epi32(0x000000ff);
                counter[0] = _mm256_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm256_add_epi32(counter[1], _mm256_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm256_add_epi32(counter[2], _mm256_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm256_add_epi32(counter[3], _mm256_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_avx2(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm256_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm256_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm256_set1_epi8(0x0f), 4, t2);

            const __m256i mask_byte0 = _mm256_set1_epi32(0x000000ff);
            counter[0] = _mm256_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm256_add_epi32(counter[1], _mm256_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm256_add_epi32(counter[2], _mm256_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm256_add_epi32(counter[3], _mm256_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm256_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm256_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm256_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm256_slli_epi32(counter[3], 4); // * 16

    flags[0] += _mm256_extract_epi32(counter[0], 0) + _mm256_extract_epi32(counter[0], 4);
    flags[1] += _mm256_extract_epi32(counter[2], 0) + _mm256_extract_epi32(counter[2], 4);
    flags[2] += _mm256_extract_epi32(counter[0], 1) + _mm256_extract_epi32(counter[0], 5);
    flags[3] += _mm256_extract_epi32(counter[2], 1) + _mm256_extract_epi32(counter[2], 5);
    flags[4] += _mm256_extract_epi32(counter[0], 2) + _mm256_extract_epi32(counter[0], 6);
    flags[5] += _mm256_extract_epi32(counter[2], 2) + _mm256_extract_epi32(counter[2], 6);
    flags[6] += _mm256_extract_epi32(counter[0], 3) + _mm256_extract_epi32(counter[0], 7);
    flags[7] += _mm256_extract_epi32(counter[2], 3) + _mm256_extract_epi32(counter[2], 7);

    flags[8]  += _mm256_extract_epi32(counter[1], 0) + _mm256_extract_epi32(counter[1], 4);
    flags[9]  += _mm256_extract_epi32(counter[3], 0) + _mm256_extract_epi32(counter[3], 4);
    flags[10] += _mm256_extract_epi32(counter[1], 1) + _mm256_extract_epi32(counter[1], 5);
    flags[11] += _mm256_extract_epi32(counter[3], 1) + _mm256_extract_epi32(counter[3], 5);
    flags[12] += _mm256_extract_epi32(counter[1], 2) + _mm256_extract_epi32(counter[1], 6);
    flags[13] += _mm256_extract_epi32(counter[3], 2) + _mm256_extract_epi32(counter[3], 6);
    flags[14] += _mm256_extract_epi32(counter[1], 3) + _mm256_extract_epi32(counter[1], 7);
    flags[15] += _mm256_extract_epi32(counter[3], 3) + _mm256_extract_epi32(counter[3], 7);

    _mm256_storeu_si256((__m256i*)buffer, v1);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm256_storeu_si256((__m256i*)buffer, v2);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm256_storeu_si256((__m256i*)buffer, v4);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm256_storeu_si256((__m256i*)buffer, v8);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}